

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O3

bool duckdb::MultiplyPropagateStatistics::Operation<int,duckdb::TryMultiplyOperator>
               (LogicalType *type,BaseStatistics *lstats,BaseStatistics *rstats,Value *new_min,
               Value *new_max)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  Value local_70;
  
  iVar2 = NumericStats::GetMin<int>(lstats);
  iVar3 = NumericStats::GetMax<int>(lstats);
  iVar4 = NumericStats::GetMin<int>(rstats);
  iVar5 = NumericStats::GetMax<int>(rstats);
  iVar6 = 0x7fffffff;
  iVar8 = -0x80000000;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    iVar10 = iVar4;
    bVar1 = true;
    do {
      bVar9 = bVar1;
      lVar11 = (long)iVar10 * (long)iVar2;
      iVar10 = (int)lVar11;
      if (iVar10 != lVar11) goto LAB_010b5a8c;
      if (iVar10 <= iVar6) {
        iVar6 = iVar10;
      }
      if (iVar8 <= iVar10) {
        iVar8 = iVar10;
      }
      iVar10 = iVar5;
      bVar1 = false;
    } while (bVar9);
    iVar2 = iVar3;
    bVar1 = false;
  } while (bVar7);
  Value::Numeric(&local_70,type,(long)iVar6);
  Value::operator=(new_min,&local_70);
  Value::~Value(&local_70);
  Value::Numeric(&local_70,type,(long)iVar8);
  Value::operator=(new_max,&local_70);
  Value::~Value(&local_70);
LAB_010b5a8c:
  return lVar11 - 0x80000000U < 0xffffffff00000000;
}

Assistant:

static bool Operation(const LogicalType &type, BaseStatistics &lstats, BaseStatistics &rstats, Value &new_min,
	                      Value &new_max) {
		// statistics propagation on the multiplication is slightly less straightforward because of negative numbers
		// the new min/max depend on the signs of the input types
		// if both are positive the result is [lmin * rmin][lmax * rmax]
		// if lmin/lmax are negative the result is [lmin * rmax][lmax * rmin]
		// etc
		// rather than doing all this switcheroo we just multiply all combinations of lmin/lmax with rmin/rmax
		// and check what the minimum/maximum value is
		T lvals[] {NumericStats::GetMin<T>(lstats), NumericStats::GetMax<T>(lstats)};
		T rvals[] {NumericStats::GetMin<T>(rstats), NumericStats::GetMax<T>(rstats)};
		T min = NumericLimits<T>::Maximum();
		T max = NumericLimits<T>::Minimum();
		// multiplications
		for (idx_t l = 0; l < 2; l++) {
			for (idx_t r = 0; r < 2; r++) {
				T result;
				if (!OP::Operation(lvals[l], rvals[r], result)) {
					// potential overflow
					return true;
				}
				if (result < min) {
					min = result;
				}
				if (result > max) {
					max = result;
				}
			}
		}
		new_min = Value::Numeric(type, min);
		new_max = Value::Numeric(type, max);
		return false;
	}